

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataListGather
               (TupleDataLayout *layout,Vector *row_locations,idx_t col_idx,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> param_8,
               vector<duckdb::TupleDataGatherFunction,_true> *child_functions)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  long *plVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  tuple_data_gather_function_t p_Var7;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  TupleDataLayout *pTVar11;
  const_reference pvVar12;
  idx_t iVar13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  const_reference pvVar16;
  Vector *pVVar17;
  ulong uVar18;
  idx_t required_capacity;
  ulong uVar19;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  TupleDataLayout *local_c8;
  buffer_ptr<ValidityBuffer> *local_c0;
  idx_t local_b8;
  LogicalType local_b0;
  Vector heap_locations;
  
  pdVar2 = row_locations->data;
  pdVar3 = target->data;
  FlatVector::VerifyFlatVector(target);
  LogicalType::LogicalType(&local_b0,POINTER);
  Vector::Vector(&heap_locations,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  pvVar12 = vector<unsigned_long,_true>::operator[](&layout->offsets,col_idx);
  vVar4 = *pvVar12;
  local_c8 = layout;
  iVar13 = ListVector::GetListSize(target);
  required_capacity = iVar13;
  if (scan_count != 0) {
    local_c0 = &(target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar19 = 0;
    do {
      uVar14 = uVar19;
      if (scan_sel->sel_vector != (sel_t *)0x0) {
        uVar14 = (ulong)scan_sel->sel_vector[uVar19];
      }
      uVar18 = uVar19;
      if (target_sel->sel_vector != (sel_t *)0x0) {
        uVar18 = (ulong)target_sel->sel_vector[uVar19];
      }
      if ((1 << ((byte)col_idx & 7) &
          (uint)*(byte *)(*(long *)(pdVar2 + uVar14 * 8) + (col_idx >> 3))) == 0) {
        if ((target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_b8 = (target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_d8,&local_b8);
          p_Var10 = p_Stack_d0;
          peVar9 = local_d8;
          local_d8 = (element_type *)0x0;
          p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_c0);
          (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar8 = (byte)uVar18 & 0x3f;
        puVar1 = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar18 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      else {
        plVar5 = *(long **)(*(long *)(pdVar2 + uVar14 * 8) + vVar4);
        *(long **)(heap_locations.data + uVar19 * 8) = plVar5;
        lVar6 = *plVar5;
        *(long **)(heap_locations.data + uVar19 * 8) = plVar5 + 1;
        *(idx_t *)(pdVar3 + uVar18 * 0x10) = required_capacity;
        *(long *)(pdVar3 + uVar18 * 0x10 + 8) = lVar6;
        required_capacity = required_capacity + lVar6;
      }
      uVar19 = uVar19 + 1;
    } while (scan_count != uVar19);
  }
  ListVector::Reserve(target,required_capacity);
  ListVector::SetListSize(target,required_capacity);
  pvVar16 = vector<duckdb::TupleDataGatherFunction,_true>::operator[](child_functions,0);
  pTVar11 = local_c8;
  p_Var7 = pvVar16->function;
  pVVar17 = ListVector::GetEntry(target);
  (*p_Var7)(pTVar11,&heap_locations,iVar13,scan_sel,scan_count,pVVar17,target_sel,
            (optional_ptr<duckdb::Vector,_true>)target,&pvVar16->child_functions);
  if (heap_locations.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (heap_locations.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (heap_locations.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (heap_locations.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (heap_locations.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (heap_locations.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&heap_locations.type);
  return;
}

Assistant:

static void TupleDataListGather(const TupleDataLayout &layout, Vector &row_locations, const idx_t col_idx,
                                const SelectionVector &scan_sel, const idx_t scan_count, Vector &target,
                                const SelectionVector &target_sel, optional_ptr<Vector>,
                                const vector<TupleDataGatherFunction> &child_functions) {
	// Source
	const auto source_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Target
	const auto target_list_entries = FlatVector::GetData<list_entry_t>(target);
	auto &target_list_validity = FlatVector::Validity(target);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	// Load pointers to the data from the row
	Vector heap_locations(LogicalType::POINTER);
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	auto list_size_before = ListVector::GetListSize(target);
	uint64_t target_list_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto &source_row = source_locations[scan_sel.get_index(i)];
		ValidityBytes row_mask(source_row, layout.ColumnCount());

		const auto target_idx = target_sel.get_index(i);
		if (row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
			auto &source_heap_location = source_heap_locations[i];
			source_heap_location = Load<data_ptr_t>(source_row + offset_in_row);

			// Load list size and skip over
			const auto list_length = Load<uint64_t>(source_heap_location);
			source_heap_location += sizeof(uint64_t);

			// Initialize list entry, and increment offset
			auto &target_list_entry = target_list_entries[target_idx];
			target_list_entry.offset = target_list_offset;
			target_list_entry.length = list_length;
			target_list_offset += list_length;
		} else {
			target_list_validity.SetInvalid(target_idx);
		}
	}
	ListVector::Reserve(target, target_list_offset);
	ListVector::SetListSize(target, target_list_offset);

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	const auto &child_function = child_functions[0];
	child_function.function(layout, heap_locations, list_size_before, scan_sel, scan_count,
	                        ListVector::GetEntry(target), target_sel, &target, child_function.child_functions);
}